

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

void * google::protobuf::internal::TcParser::MaybeGetSplitBase
                 (MessageLite *msg,bool is_split,TcParseTableBase *table)

{
  uint uVar1;
  MessageLite *__src;
  void **ppvVar2;
  void *__dest;
  MessageLite *pMVar3;
  undefined7 in_register_00000031;
  Arena *this;
  ulong size;
  
  pMVar3 = msg;
  if ((int)CONCAT71(in_register_00000031,is_split) != 0) {
    uVar1 = *(uint *)(&table->fast_idx_mask + table->aux_offset);
    ppvVar2 = RefAt<void*>(table->class_data->prototype,(ulong)uVar1);
    __src = (MessageLite *)*ppvVar2;
    ppvVar2 = RefAt<void*>(msg,(ulong)uVar1);
    pMVar3 = (MessageLite *)*ppvVar2;
    if ((MessageLite *)*ppvVar2 == __src) {
      size = (ulong)*(uint *)((long)&table->field_entries_offset + (ulong)table->aux_offset);
      this = (Arena *)(msg->_internal_metadata_).ptr_;
      if (((ulong)this & 1) != 0) {
        this = *(Arena **)((ulong)this & 0xfffffffffffffffe);
      }
      if (this == (Arena *)0x0) {
        __dest = operator_new(size);
      }
      else {
        __dest = Arena::AllocateAligned(this,size,8);
      }
      *ppvVar2 = __dest;
      memcpy(__dest,__src,size);
      pMVar3 = (MessageLite *)*ppvVar2;
    }
  }
  return pMVar3;
}

Assistant:

void* TcParser::MaybeGetSplitBase(MessageLite* msg, const bool is_split,
                                  const TcParseTableBase* table) {
  void* out = msg;
  if (is_split) {
    const uint32_t split_offset = GetSplitOffset(table);
    void* default_split =
        TcParser::RefAt<void*>(table->default_instance(), split_offset);
    void*& split = TcParser::RefAt<void*>(msg, split_offset);
    if (split == default_split) {
      // Allocate split instance when needed.
      uint32_t size = GetSizeofSplit(table);
      Arena* arena = msg->GetArena();
      split = (arena == nullptr) ? ::operator new(size)
                                 : arena->AllocateAligned(size);
      memcpy(split, default_split, size);
    }
    out = split;
  }
  return out;
}